

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall kj::Own<kj::Exception::Context>::dispose(Own<kj::Exception::Context> *this)

{
  Context *object;
  Context *ptrCopy;
  Own<kj::Exception::Context> *this_local;
  
  object = this->ptr;
  if (object != (Context *)0x0) {
    this->ptr = (Context *)0x0;
    Disposer::dispose<kj::Exception::Context>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }